

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGClient.cpp
# Opt level: O2

bool __thiscall
ViconCGStreamClientSDK::VCGClient::SetApexDeviceFeedback(VCGClient *this,uint i_DeviceID,bool i_bOn)

{
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *this_00;
  _Rb_tree_header *p_Var1;
  __shared_ptr<VViconCGStreamClient,_(__gnu_cxx::_Lock_policy)2> *p_Var2;
  iterator It;
  iterator __position;
  undefined7 in_register_00000011;
  __shared_ptr<VViconCGStreamClient,_(__gnu_cxx::_Lock_policy)2> *p_Var3;
  shared_ptr<VViconCGStreamClient> pClient;
  uint local_44;
  __shared_ptr<VViconCGStreamClient,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  this_00 = &this->m_HapticDeviceOnList;
  local_44 = i_DeviceID;
  __position = std::
               _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
               ::find(&this_00->_M_t,&local_44);
  p_Var1 = &(this->m_HapticDeviceOnList)._M_t._M_impl.super__Rb_tree_header;
  if ((int)CONCAT71(in_register_00000011,i_bOn) == 0) {
    if ((_Rb_tree_header *)__position._M_node == p_Var1) {
      return false;
    }
    std::
    _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
    ::erase_abi_cxx11_((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                        *)this_00,(const_iterator)__position._M_node);
  }
  else {
    if ((_Rb_tree_header *)__position._M_node != p_Var1) {
      return false;
    }
    std::
    _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
    ::_M_insert_unique<unsigned_int_const&>
              ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                *)this_00,&local_44);
  }
  p_Var2 = &((this->m_pClients).
             super__Vector_base<std::shared_ptr<VViconCGStreamClient>,_std::allocator<std::shared_ptr<VViconCGStreamClient>_>_>
             ._M_impl.super__Vector_impl_data._M_finish)->
            super___shared_ptr<VViconCGStreamClient,_(__gnu_cxx::_Lock_policy)2>;
  for (p_Var3 = &((this->m_pClients).
                  super__Vector_base<std::shared_ptr<VViconCGStreamClient>,_std::allocator<std::shared_ptr<VViconCGStreamClient>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->
                 super___shared_ptr<VViconCGStreamClient,_(__gnu_cxx::_Lock_policy)2>;
      p_Var3 != p_Var2; p_Var3 = p_Var3 + 1) {
    std::__shared_ptr<VViconCGStreamClient,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_40,p_Var3);
    VViconCGStreamClient::SetApexDeviceFeedback(local_40._M_ptr,this_00);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
  }
  return true;
}

Assistant:

bool VCGClient::SetApexDeviceFeedback( unsigned int i_DeviceID, bool i_bOn )
{
  if( i_bOn )
  {
    if( m_HapticDeviceOnList.find( i_DeviceID ) != m_HapticDeviceOnList.end() )
    {
      return false;
    }
    m_HapticDeviceOnList.insert( i_DeviceID );
  }
  else
  {
    std::set< unsigned int >::iterator It = m_HapticDeviceOnList.find( i_DeviceID );
    if( It== m_HapticDeviceOnList.end() )
    {
      return false;
    } 
    m_HapticDeviceOnList.erase( It );
    
  }

  for( auto pClient : m_pClients )
  {
    pClient->SetApexDeviceFeedback( m_HapticDeviceOnList );
  }

  return true;
}